

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

uint64_t __thiscall CLIntercept::computeHash(CLIntercept *this,void *ptr,size_t length)

{
  size_t in_RDX;
  void *in_RSI;
  uint64_t hash;
  undefined8 local_20;
  
  local_20 = 0;
  if (in_RSI != (void *)0x0) {
    local_20 = Hash(in_RSI,in_RDX);
  }
  return local_20;
}

Assistant:

uint64_t CLIntercept::computeHash(
    const void* ptr,
    size_t length )
{
    uint64_t    hash = 0;

    if( ptr != NULL )
    {
        hash = Hash( ptr, length );
    }

    return hash;
}